

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
__thiscall anon_unknown.dwarf_ecf33::MkdirTool::createCommand(MkdirTool *this,StringRef name)

{
  unique_ptr<(anonymous_namespace)::MkdirCommand,_std::default_delete<(anonymous_namespace)::MkdirCommand>_>
  local_30;
  type res;
  MkdirTool *this_local;
  StringRef name_local;
  
  this_local = (MkdirTool *)name.Length;
  res._M_t.
  super___uniq_ptr_impl<(anonymous_namespace)::MkdirCommand,_std::default_delete<(anonymous_namespace)::MkdirCommand>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::MkdirCommand_*,_std::default_delete<(anonymous_namespace)::MkdirCommand>_>
  .super__Head_base<0UL,_(anonymous_namespace)::MkdirCommand_*,_false>._M_head_impl =
       (__uniq_ptr_data<(anonymous_namespace)::MkdirCommand,_std::default_delete<(anonymous_namespace)::MkdirCommand>,_true,_true>
        )name.Data;
  name_local.Length = (size_t)this;
  llvm::make_unique<(anonymous_namespace)::MkdirCommand,llvm::StringRef&>
            ((llvm *)&local_30,(StringRef *)&this_local);
  std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>
  ::
  unique_ptr<(anonymous_namespace)::MkdirCommand,std::default_delete<(anonymous_namespace)::MkdirCommand>,void>
            ((unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>
              *)this,&local_30);
  std::
  unique_ptr<(anonymous_namespace)::MkdirCommand,_std::default_delete<(anonymous_namespace)::MkdirCommand>_>
  ::~unique_ptr(&local_30);
  return (__uniq_ptr_data<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>,_true,_true>
          )(__uniq_ptr_data<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>,_true,_true>
            )this;
}

Assistant:

virtual std::unique_ptr<Command> createCommand(StringRef name) override {
    auto res = llvm::make_unique<MkdirCommand>(name);
    return res;
  }